

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O3

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::RenameColumn
          (DuckTableEntry *this,ClientContext *context,RenameColumnInfo *info)

{
  __node_base *__ht;
  ForeignKeyType FVar1;
  SchemaCatalogEntry *pSVar2;
  pointer pCVar3;
  pointer pbVar4;
  _func_int **pp_Var5;
  Catalog *catalog;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> _Var6;
  bool bVar7;
  int iVar8;
  CreateTableInfo *this_00;
  pointer pCVar9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  ColumnDefinition *this_02;
  LogicalIndex LVar10;
  ParsedExpression *expr;
  reference this_03;
  pointer pCVar11;
  CheckConstraint *pCVar12;
  type expr_00;
  UniqueConstraint *this_04;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar13;
  ForeignKeyConstraint *pFVar14;
  reference pvVar15;
  Binder *info_00;
  type info_01;
  DuckTableEntry *this_05;
  InternalException *this_06;
  CatalogException *pCVar16;
  RenameColumnInfo *in_RCX;
  size_type sVar17;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_07;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column_name;
  pointer pbVar18;
  ColumnListIterator CVar19;
  shared_ptr<duckdb::Binder,_true> binder;
  ColumnDefinition copy;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_280;
  undefined1 local_278 [24];
  undefined1 local_260 [16];
  __node_base local_250;
  ClientContext *local_248;
  undefined1 local_240 [24];
  optional_ptr<duckdb::CatalogSet,_true> local_228;
  _Alloc_hider local_220;
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  LogicalType local_1e0 [2];
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_1a8;
  Value local_1a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  a_Stack_160 [56];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  undefined1 local_108 [88];
  __node_base local_b0;
  Value local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  local_228.ptr = (CatalogSet *)&in_RCX->old_name;
  local_278._8_8_ = in_RCX;
  local_218._M_head_impl = (CatalogEntry *)this;
  local_210._M_allocated_capacity = (size_type)info;
  local_220._M_p =
       (pointer)TableCatalogEntry::GetColumnIndex
                          ((TableCatalogEntry *)context,(string *)local_228.ptr,false);
  if (local_220._M_p == (pointer)0xffffffffffffffff) {
    pCVar16 = (CatalogException *)__cxa_allocate_exception(0x10);
    local_200._0_8_ = local_200 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"Cannot rename rowid column","");
    CatalogException::CatalogException(pCVar16,(string *)local_200);
    __cxa_throw(pCVar16,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pSVar2 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  this_00 = (CreateTableInfo *)operator_new(0x1d8);
  local_200._0_8_ = (_Hash_node_base *)(local_200 + 0x10);
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_200,*(long *)&context->interrupted,
             (long)&(((context->registered_state).
                      super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                      .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl)
                    ->lock).super___mutex_base._M_mutex + *(long *)&context->interrupted);
  CreateTableInfo::CreateTableInfo(this_00,pSVar2,(string *)local_200);
  local_280._M_head_impl = this_00;
  if ((_Hash_node_base *)local_200._0_8_ != (_Hash_node_base *)(local_200 + 0x10)) {
    operator_delete((void *)local_200._0_8_);
  }
  bVar7 = *(bool *)((long)&(context->config).home_directory._M_string_length + 1);
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_280);
  (pCVar9->super_CreateInfo).temporary = bVar7;
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_280);
  Value::operator=(&(pCVar9->super_CreateInfo).comment,
                   (Value *)((long)&(context->config).home_directory.field_2 + 8));
  pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_280);
  __ht = &(context->config).profiler_settings._M_h._M_before_begin;
  this_01 = &(pCVar9->super_CreateInfo).tags;
  if ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)__ht != this_01) {
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)this_01,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)__ht);
  }
  CVar19 = ColumnList::Logical((ColumnList *)&(context->config).asof_loop_join_threshold);
  local_260._0_8_ = CVar19.list;
  local_260[8] = CVar19.physical;
  if (((undefined1  [16])CVar19 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    pCVar3 = (((vector<duckdb::ColumnDefinition,_true> *)
              &((element_type *)local_260._0_8_)->super_enable_shared_from_this<duckdb::Binder>)->
             super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>).
             super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_248 = (ClientContext *)
                (((long)pCVar3 -
                  (long)(((vector<duckdb::ColumnDefinition,_true> *)
                         &((element_type *)local_260._0_8_)->
                          super_enable_shared_from_this<duckdb::Binder>)->
                        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ).
                        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed);
    local_278._16_8_ =
         ((long)pCVar3 -
          (long)(((vector<duckdb::ColumnDefinition,_true> *)
                 &((element_type *)local_260._0_8_)->super_enable_shared_from_this<duckdb::Binder>)
                ->super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>)
                .
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
  }
  else {
    local_278._16_8_ =
         (long)(((element_type *)local_260._0_8_)->bound_ctes)._M_h._M_bucket_count -
         (long)(((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                &(((element_type *)local_260._0_8_)->bound_ctes)._M_h._M_buckets)->_M_impl).
               super__Vector_impl_data._M_start >> 3;
    local_248 = (ClientContext *)local_278._16_8_;
  }
  local_250._M_nxt = (_Hash_node_base *)0x0;
  local_240._16_8_ =
       &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_278._8_8_ + 0x90))->_M_use_count;
  local_210._8_8_ = &(context->config).user_variables._M_h._M_element_count;
  this_07 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)(local_200 + 0xa0);
  local_240._8_8_ = local_260._0_8_;
  while (((local_250._M_nxt != (_Hash_node_base *)local_278._16_8_ ||
          (local_248 != (ClientContext *)local_278._16_8_)) || (local_260._0_8_ != local_240._8_8_))
        ) {
    this_02 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                        ((ColumnLogicalIteratorInternal *)local_260);
    ColumnDefinition::Copy((ColumnDefinition *)local_200,this_02);
    LVar10 = ColumnDefinition::Logical(this_02);
    if (local_220._M_p == (pointer)LVar10.index) {
      ColumnDefinition::SetName((ColumnDefinition *)local_200,(string *)local_240._16_8_);
    }
    bVar7 = ColumnDefinition::Generated(this_02);
    if (bVar7) {
      LVar10 = ColumnDefinition::Logical(this_02);
      bVar7 = ColumnDependencyManager::IsDependencyOf
                        ((ColumnDependencyManager *)local_210._8_8_,LVar10,
                         (LogicalIndex)local_220._M_p);
      if (bVar7) {
        expr = ColumnDefinition::GeneratedExpressionMutable((ColumnDefinition *)local_200);
        RenameExpression(expr,(RenameColumnInfo *)local_278._8_8_);
      }
    }
    pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_280);
    if ((_Hash_node_base *)local_200._0_8_ == (_Hash_node_base *)(local_200 + 0x10)) {
      local_108._24_8_ = local_1f0._8_8_;
      local_108._0_8_ = local_108 + 0x10;
    }
    else {
      local_108._0_8_ = local_200._0_8_;
    }
    local_108._17_7_ = local_1f0._M_allocated_capacity._1_7_;
    local_108[0x10] = local_1f0._M_local_buf[0];
    local_108._8_8_ = local_200._8_8_;
    local_200._8_8_ = 0;
    local_1f0._M_local_buf[0] = '\0';
    local_200._0_8_ = (_Hash_node_base *)(local_200 + 0x10);
    LogicalType::LogicalType((LogicalType *)(local_108 + 0x20),(LogicalType *)(local_200 + 0x20));
    local_108._73_8_ = stack0xfffffffffffffe49;
    local_108[0x38] = local_1e0[1].id_;
    local_108[0x39] = local_1e0[1].physical_type_;
    local_108._58_6_ = local_1e0[1]._2_6_;
    local_b0._M_nxt = (_Hash_node_base *)local_1a8._M_head_impl;
    local_1a8._M_head_impl = (ParsedExpression *)0x0;
    Value::Value(&local_a8,(Value *)(local_200 + 0x60));
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable(local_68,this_07,this_07);
    ColumnList::AddColumn(&pCVar9->columns,(ColumnDefinition *)local_108);
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(local_68);
    Value::~Value(&local_a8);
    if ((ParsedExpression *)local_b0._M_nxt != (ParsedExpression *)0x0) {
      (*((BaseExpression *)&(local_b0._M_nxt)->_M_nxt)->_vptr_BaseExpression[1])();
    }
    local_b0._M_nxt = (_Hash_node_base *)0x0;
    LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_);
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(this_07);
    Value::~Value((Value *)(local_200 + 0x60));
    if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         )local_1a8._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)local_1a8._M_head_impl + 8))();
    }
    local_1a8._M_head_impl = (ParsedExpression *)0x0;
    LogicalType::~LogicalType((LogicalType *)(local_200 + 0x20));
    if ((_Hash_node_base *)local_200._0_8_ != (_Hash_node_base *)(local_200 + 0x10)) {
      operator_delete((void *)local_200._0_8_);
    }
    local_250._M_nxt =
         (_Hash_node_base *)
         ((long)&(((enable_shared_from_this<duckdb::ClientContext> *)&(local_250._M_nxt)->_M_nxt)->
                 __weak_this_).internal.
                 super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1);
  }
  if ((context->config).set_variables._M_h._M_single_bucket !=
      (__node_base_ptr)(context->config).set_variables._M_h._M_rehash_policy._M_next_resize) {
    local_278._16_8_ = &(context->config).set_variables._M_h._M_rehash_policy._M_next_resize;
    __n = 0;
    do {
      this_03 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                              *)local_278._16_8_,__n);
      pCVar11 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->(this_03);
      (*pCVar11->_vptr_Constraint[3])
                ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_278,pCVar11);
      pCVar11 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                            *)local_278);
      switch(pCVar11->type) {
      case NOT_NULL:
        break;
      case CHECK:
        pCVar11 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                              *)local_278);
        pCVar12 = Constraint::Cast<duckdb::CheckConstraint>(pCVar11);
        expr_00 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(&pCVar12->expression);
        RenameExpression(expr_00,(RenameColumnInfo *)local_278._8_8_);
        break;
      case UNIQUE:
        pCVar11 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                              *)local_278);
        this_04 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar11);
        pvVar13 = UniqueConstraint::GetColumnNamesMutable_abi_cxx11_(this_04);
        pbVar4 = (pvVar13->
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar18 = (pvVar13->
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar18 != pbVar4;
            pbVar18 = pbVar18 + 1) {
          pp_Var5 = (_func_int **)pbVar18->_M_string_length;
          if ((pp_Var5 ==
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_278._8_8_ + 0x80))->
               _vptr__Sp_counted_base) &&
             ((pp_Var5 == (_func_int **)0x0 ||
              (iVar8 = bcmp((pbVar18->_M_dataplus)._M_p,
                            ((_Alloc_hider *)&(local_228.ptr)->catalog)->_M_p,(size_t)pp_Var5),
              iVar8 == 0)))) {
            ::std::__cxx11::string::_M_assign((string *)pbVar18);
          }
        }
        break;
      case FOREIGN_KEY:
        pCVar11 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                              *)local_278);
        pFVar14 = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar11);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_260,
                 &(pFVar14->pk_columns).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
        FVar1 = (pFVar14->info).type;
        if (FVar1 == FK_TYPE_FOREIGN_KEY_TABLE) {
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_260,
                      &(pFVar14->fk_columns).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     );
        }
        else if ((FVar1 == FK_TYPE_SELF_REFERENCE_TABLE) &&
                ((pFVar14->fk_columns).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish !=
                 (pFVar14->fk_columns).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)) {
          sVar17 = 0;
          do {
            pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[](&pFVar14->fk_columns,sVar17);
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_260,pvVar15);
            sVar17 = sVar17 + 1;
          } while (sVar17 < (ulong)((long)(pFVar14->fk_columns).
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pFVar14->fk_columns).
                                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 5));
        }
        if ((element_type *)CONCAT71(local_260._9_7_,local_260[8]) !=
            (element_type *)local_260._0_8_) {
          sVar17 = 0;
          do {
            pvVar15 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                    *)local_260,sVar17);
            pp_Var5 = (_func_int **)pvVar15->_M_string_length;
            if ((pp_Var5 ==
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_278._8_8_ + 0x80))->
                 _vptr__Sp_counted_base) &&
               ((pp_Var5 == (_func_int **)0x0 ||
                (iVar8 = bcmp((pvVar15->_M_dataplus)._M_p,
                              ((_Alloc_hider *)&(local_228.ptr)->catalog)->_M_p,(size_t)pp_Var5),
                iVar8 == 0)))) {
              pCVar16 = (CatalogException *)__cxa_allocate_exception(0x10);
              local_200._0_8_ = local_200 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_200,
                         "Cannot rename column \"%s\" because this is involved in the foreign key constraint"
                         ,"");
              local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_128,
                         *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   (local_278._8_8_ + 0x70))->_M_use_count,
                         (long)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                               (local_278._8_8_ + 0x80))->_vptr__Sp_counted_base +
                         *(long *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                   (local_278._8_8_ + 0x70))->_M_use_count);
              CatalogException::CatalogException<std::__cxx11::string>
                        (pCVar16,(string *)local_200,&local_128);
              __cxa_throw(pCVar16,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
            }
            sVar17 = sVar17 + 1;
          } while (sVar17 < (ulong)(CONCAT71(local_260._9_7_,local_260[8]) - local_260._0_8_ >> 5));
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_260);
        break;
      default:
        this_06 = (InternalException *)__cxa_allocate_exception(0x10);
        local_200._0_8_ = local_200 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_200,"Unsupported constraint for entry!","");
        InternalException::InternalException(this_06,(string *)local_200);
        __cxa_throw(this_06,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pCVar9 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_280);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar9->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_278);
      if ((BoundCreateTableInfo *)local_278._0_8_ != (BoundCreateTableInfo *)0x0) {
        (*(code *)((*(SchemaCatalogEntry **)local_278._0_8_)->super_InCatalogEntry).
                  super_CatalogEntry.oid)();
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)((long)(context->config).set_variables._M_h._M_single_bucket -
                                 (context->config).set_variables._M_h._M_rehash_policy.
                                 _M_next_resize) >> 3));
  }
  Binder::CreateBinder
            ((Binder *)local_260,(ClientContext *)local_210._M_allocated_capacity,
             (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
  info_00 = shared_ptr<duckdb::Binder,_true>::operator->
                      ((shared_ptr<duckdb::Binder,_true> *)local_260);
  local_240._0_8_ = local_280._M_head_impl;
  local_280._M_head_impl = (CreateTableInfo *)0x0;
  Binder::BindCreateTableInfo
            ((Binder *)local_278,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             info_00,(SchemaCatalogEntry *)local_240);
  if ((CreateTableInfo *)local_240._0_8_ != (CreateTableInfo *)0x0) {
    (*(((CreateInfo *)local_240._0_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  local_240._0_8_ = (_func_int **)0x0;
  catalog = (Catalog *)(context->config).max_expression_depth;
  pSVar2 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
  info_01 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                         *)local_278);
  this_05 = (DuckTableEntry *)operator_new(0x298);
  local_200._0_8_ = (context->config).user_variables._M_h._M_bucket_count;
  local_200._8_8_ = (context->config).user_variables._M_h._M_before_begin._M_nxt;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_200._8_8_ + 8) = *(_Atomic_word *)(local_200._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_200._8_8_ + 8) = *(_Atomic_word *)(local_200._8_8_ + 8) + 1;
    }
  }
  DuckTableEntry(this_05,catalog,pSVar2,info_01,(shared_ptr<duckdb::DataTable,_true> *)local_200);
  if (local_200._8_8_ != 0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_200._8_8_);
  }
  _Var6._M_head_impl = local_218._M_head_impl;
  (local_218._M_head_impl)->_vptr_CatalogEntry = (_func_int **)this_05;
  if ((__uniq_ptr_impl<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)local_278._0_8_
      != (__uniq_ptr_impl<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)0x0) {
    ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
              ((default_delete<duckdb::BoundCreateTableInfo> *)local_278,
               (BoundCreateTableInfo *)local_278._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(local_260._9_7_,local_260[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(local_260._9_7_,local_260[8]));
  }
  if (local_280._M_head_impl != (CreateTableInfo *)0x0) {
    (*((local_280._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>_>)
         _Var6._M_head_impl;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::RenameColumn(ClientContext &context, RenameColumnInfo &info) {
	auto rename_idx = GetColumnIndex(info.old_name);
	if (rename_idx.index == COLUMN_IDENTIFIER_ROW_ID) {
		throw CatalogException("Cannot rename rowid column");
	}
	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;
	for (auto &col : columns.Logical()) {
		auto copy = col.Copy();
		if (rename_idx == col.Logical()) {
			copy.SetName(info.new_name);
		}
		if (col.Generated() && column_dependency_manager.IsDependencyOf(col.Logical(), rename_idx)) {
			RenameExpression(copy.GeneratedExpressionMutable(), info);
		}
		create_info->columns.AddColumn(std::move(copy));
	}
	for (idx_t c_idx = 0; c_idx < constraints.size(); c_idx++) {
		auto copy = constraints[c_idx]->Copy();
		switch (copy->type) {
		case ConstraintType::NOT_NULL:
			// NOT NULL constraint: no adjustments necessary
			break;
		case ConstraintType::CHECK: {
			// CHECK constraint: need to rename column references that refer to the renamed column
			auto &check = copy->Cast<CheckConstraint>();
			RenameExpression(*check.expression, info);
			break;
		}
		case ConstraintType::UNIQUE: {
			// UNIQUE constraint: possibly need to rename columns
			auto &unique = copy->Cast<UniqueConstraint>();
			for (auto &column_name : unique.GetColumnNamesMutable()) {
				if (column_name == info.old_name) {
					column_name = info.new_name;
				}
			}
			break;
		}
		case ConstraintType::FOREIGN_KEY: {
			// FOREIGN KEY constraint: possibly need to rename columns
			auto &fk = copy->Cast<ForeignKeyConstraint>();
			vector<string> columns = fk.pk_columns;
			if (fk.info.type == ForeignKeyType::FK_TYPE_FOREIGN_KEY_TABLE) {
				columns = fk.fk_columns;
			} else if (fk.info.type == ForeignKeyType::FK_TYPE_SELF_REFERENCE_TABLE) {
				for (idx_t i = 0; i < fk.fk_columns.size(); i++) {
					columns.push_back(fk.fk_columns[i]);
				}
			}
			for (idx_t i = 0; i < columns.size(); i++) {
				if (columns[i] == info.old_name) {
					throw CatalogException(
					    "Cannot rename column \"%s\" because this is involved in the foreign key constraint",
					    info.old_name);
				}
			}
			break;
		}
		default:
			throw InternalException("Unsupported constraint for entry!");
		}
		create_info->constraints.push_back(std::move(copy));
	}
	auto binder = Binder::CreateBinder(context);
	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
}